

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_data.hpp
# Opt level: O2

void __thiscall duckdb::UnionBoundCastData::~UnionBoundCastData(UnionBoundCastData *this)

{
  ~UnionBoundCastData(this);
  operator_delete(this);
  return;
}

Assistant:

UnionBoundCastData(union_tag_t member_idx, string name, LogicalType type, int64_t cost,
	                   BoundCastInfo member_cast_info)
	    : tag(member_idx), name(std::move(name)), type(std::move(type)), cost(cost),
	      member_cast_info(std::move(member_cast_info)) {
	}